

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface.c
# Opt level: O1

int run_test_udp_multicast_interface(void)

{
  int iVar1;
  int iVar2;
  uv_udp_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  sockaddr_in baddr;
  sockaddr_in addr;
  uv_udp_send_t req;
  undefined1 auStack_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uv_udp_t local_148;
  
  pcVar5 = "239.255.0.1";
  iVar2 = 0x23a3;
  iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,local_168);
  if (iVar1 == 0) {
    puVar3 = (uv_udp_t *)uv_default_loop();
    iVar2 = 0x537990;
    iVar1 = uv_udp_init();
    if (iVar1 != 0) goto LAB_00179fbe;
    pcVar5 = "0.0.0.0";
    iVar2 = 0;
    iVar1 = uv_ip4_addr("0.0.0.0",0,auStack_178);
    puVar3 = (uv_udp_t *)pcVar5;
    if (iVar1 != 0) goto LAB_00179fc3;
    puVar3 = &server;
    iVar2 = (int)auStack_178;
    iVar1 = uv_udp_bind(&server,auStack_178,0);
    if (iVar1 != 0) goto LAB_00179fc8;
    puVar3 = &server;
    iVar2 = 0x17e334;
    iVar1 = uv_udp_set_multicast_interface();
    if (iVar1 != 0) goto LAB_00179fcd;
    local_158 = uv_buf_init("PING",4);
    iVar2 = 0x537990;
    puVar3 = &local_148;
    iVar1 = uv_udp_send(puVar3,&server,local_158,1,local_168,sv_send_cb);
    if (iVar1 != 0) goto LAB_00179fd2;
    if (close_cb_called != 0) goto LAB_00179fd7;
    if (sv_send_cb_called != 0) goto LAB_00179fdc;
    puVar3 = (uv_udp_t *)uv_default_loop();
    iVar2 = 0;
    uv_run();
    if (sv_send_cb_called != 1) goto LAB_00179fe1;
    if (close_cb_called != 1) goto LAB_00179fe6;
    if (server.send_queue_size != 0) goto LAB_00179feb;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    iVar2 = 0;
    uv_run(uVar4);
    puVar3 = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_udp_multicast_interface_cold_1();
    puVar3 = (uv_udp_t *)pcVar5;
LAB_00179fbe:
    run_test_udp_multicast_interface_cold_2();
LAB_00179fc3:
    run_test_udp_multicast_interface_cold_3();
LAB_00179fc8:
    run_test_udp_multicast_interface_cold_4();
LAB_00179fcd:
    run_test_udp_multicast_interface_cold_5();
LAB_00179fd2:
    run_test_udp_multicast_interface_cold_6();
LAB_00179fd7:
    run_test_udp_multicast_interface_cold_7();
LAB_00179fdc:
    run_test_udp_multicast_interface_cold_8();
LAB_00179fe1:
    run_test_udp_multicast_interface_cold_9();
LAB_00179fe6:
    run_test_udp_multicast_interface_cold_10();
LAB_00179feb:
    run_test_udp_multicast_interface_cold_11();
  }
  run_test_udp_multicast_interface_cold_12();
  if (puVar3 == (uv_udp_t *)0x0) {
    sv_send_cb_cold_3();
  }
  else {
    if ((1 < iVar2 + 1U) && (iVar2 != -0x65)) goto LAB_0017a047;
    puVar3 = (uv_udp_t *)(puVar3->u).reserved[2];
    if (puVar3 == &client || puVar3 == &server) {
      sv_send_cb_called = sv_send_cb_called + 1;
      iVar2 = uv_close(puVar3,close_cb);
      return iVar2;
    }
  }
  sv_send_cb_cold_1();
LAB_0017a047:
  sv_send_cb_cold_2();
  if (puVar3 == &client || puVar3 == &server) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x5379,puVar3 == &server);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(puVar3,0);
  return iVar2;
}

Assistant:

TEST_IMPL(udp_multicast_interface) {
  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in addr;
  struct sockaddr_in baddr;

  ASSERT(0 == uv_ip4_addr("239.255.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("0.0.0.0", 0, &baddr));
  r = uv_udp_bind(&server, (const struct sockaddr*)&baddr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_multicast_interface(&server, "0.0.0.0");
  ASSERT(r == 0);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*)&addr,
                  sv_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(sv_send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}